

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O3

void EVP_EncodeUpdate(EVP_ENCODE_CTX *ctx,uchar *out,int *outl,uchar *in,int inl)

{
  size_t __n;
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  ulong __n_00;
  ulong uVar3;
  undefined4 in_register_00000084;
  uchar *puVar4;
  undefined4 extraout_var_00;
  
  *outl = 0;
  if (CONCAT44(in_register_00000084,inl) != 0) {
    uVar3 = (ulong)(uint)ctx->num;
    if (0x2f < uVar3) {
      __assert_fail("ctx->data_used < sizeof(ctx->data)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/base64/base64.cc"
                    ,0x65,
                    "void EVP_EncodeUpdate(EVP_ENCODE_CTX *, uint8_t *, int *, const uint8_t *, size_t)"
                   );
    }
    __n = CONCAT44(in_register_00000084,inl);
    __n_00 = 0x30 - uVar3;
    if (CONCAT44(in_register_00000084,inl) < __n_00) {
      memcpy(ctx->enc_data + (uVar3 - 4),in,__n);
      ctx->num = ctx->num + inl;
    }
    else {
      if (uVar3 == 0) {
        uVar3 = 0;
      }
      else {
        memcpy(ctx->enc_data + (uVar3 - 4),in,__n_00);
        in = in + __n_00;
        iVar1 = EVP_EncodeBlock(out,(uchar *)&ctx->length,0x30);
        ctx->num = 0;
        puVar4 = out + CONCAT44(extraout_var,iVar1);
        out = puVar4 + 1;
        puVar4[0] = '\n';
        puVar4[1] = '\0';
        uVar3 = CONCAT44(extraout_var,iVar1) + 1;
        __n = CONCAT44(in_register_00000084,inl) - __n_00;
      }
      for (; 0x2f < __n; __n = __n - 0x30) {
        iVar1 = EVP_EncodeBlock(out,in,0x30);
        lVar2 = CONCAT44(extraout_var_00,iVar1);
        (out + lVar2)[0] = '\n';
        (out + lVar2)[1] = '\0';
        if (-lVar2 - 2U < uVar3) {
          *outl = 0;
          return;
        }
        out = out + lVar2 + 1;
        in = in + 0x30;
        uVar3 = uVar3 + lVar2 + 1;
      }
      if (__n != 0) {
        memcpy(&ctx->length,in,__n);
      }
      ctx->num = (int)__n;
      iVar1 = (int)uVar3;
      if (0x7fffffff < uVar3) {
        iVar1 = 0;
      }
      *outl = iVar1;
    }
  }
  return;
}

Assistant:

void EVP_EncodeUpdate(EVP_ENCODE_CTX *ctx, uint8_t *out, int *out_len,
                      const uint8_t *in, size_t in_len) {
  size_t total = 0;

  *out_len = 0;
  if (in_len == 0) {
    return;
  }

  assert(ctx->data_used < sizeof(ctx->data));

  if (sizeof(ctx->data) - ctx->data_used > in_len) {
    OPENSSL_memcpy(&ctx->data[ctx->data_used], in, in_len);
    ctx->data_used += (unsigned)in_len;
    return;
  }

  if (ctx->data_used != 0) {
    const size_t todo = sizeof(ctx->data) - ctx->data_used;
    OPENSSL_memcpy(&ctx->data[ctx->data_used], in, todo);
    in += todo;
    in_len -= todo;

    size_t encoded = EVP_EncodeBlock(out, ctx->data, sizeof(ctx->data));
    ctx->data_used = 0;

    out += encoded;
    *(out++) = '\n';
    *out = '\0';

    total = encoded + 1;
  }

  while (in_len >= sizeof(ctx->data)) {
    size_t encoded = EVP_EncodeBlock(out, in, sizeof(ctx->data));
    in += sizeof(ctx->data);
    in_len -= sizeof(ctx->data);

    out += encoded;
    *(out++) = '\n';
    *out = '\0';

    if (total + encoded + 1 < total) {
      *out_len = 0;
      return;
    }

    total += encoded + 1;
  }

  if (in_len != 0) {
    OPENSSL_memcpy(ctx->data, in, in_len);
  }

  ctx->data_used = (unsigned)in_len;

  if (total > INT_MAX) {
    // We cannot signal an error, but we can at least avoid making *out_len
    // negative.
    total = 0;
  }
  *out_len = (int)total;
}